

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_59::InMemoryFile::zero(InMemoryFile *this,uint64_t offset,uint64_t zeroSize)

{
  uchar *puVar1;
  int iVar2;
  undefined4 extraout_var;
  uint64_t uVar3;
  Fault f;
  uint64_t offset_local;
  uint64_t end;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  
  if (zeroSize != 0) {
    offset_local = offset;
    MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
              ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)&lock,&this->impl);
    iVar2 = (**(lock.ptr)->clock->_vptr_Clock)();
    ((lock.ptr)->lastModified).value.value = CONCAT44(extraout_var,iVar2);
    end = offset + zeroSize;
    _kjCondition.left = &end;
    _kjCondition.right = &offset_local;
    _kjCondition.op.content.ptr = " >= ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = end >= offset;
    if (end < offset) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[32]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x355,FAILED,"end >= offset","_kjCondition,\"zero() request overflows uint64\"",
                 &_kjCondition,(char (*) [32])"zero() request overflows uint64");
      kj::_::Debug::Fault::fatal(&f);
    }
    Impl::ensureCapacity(lock.ptr,end);
    uVar3 = end;
    if (end < (lock.ptr)->size) {
      uVar3 = (lock.ptr)->size;
    }
    puVar1 = ((lock.ptr)->bytes).ptr;
    (lock.ptr)->size = uVar3;
    memset(puVar1 + offset_local,0,zeroSize);
    Locked<kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked(&lock);
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t zeroSize) const override {
    if (zeroSize == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + zeroSize;
    KJ_REQUIRE(end >= offset, "zero() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memset(lock->bytes.begin() + offset, 0, zeroSize);
  }